

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm9_sign.c
# Opt level: O0

int SM9_sign(uint8_t *h,uint8_t *S,uint8_t *msg,int msglen,uint8_t *rand,uint8_t *usr_privkey,
            uint8_t *master_pubkey)

{
  int iVar1;
  G1 *a;
  GT *rop;
  GT *op;
  ATE_CTX *ctx;
  BIGNUM *range;
  G1 *h_00;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uchar *in_R8;
  long in_R9;
  ATE_CTX *p_ctx;
  GT *g;
  G2 *Ppub;
  G1 *da;
  G1 *P;
  BN_CTX *bn_ctx;
  BIGNUM *order;
  BIGNUM *r;
  BIGNUM *h_bn;
  uint8_t w [384];
  int ret;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  BN_CTX *local_1d8;
  BIGNUM *local_1c8;
  BIGNUM *local_1c0;
  ATE_CTX *in_stack_ffffffffffffff70;
  GT *in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  int local_34;
  
  local_34 = 0;
  local_1c0 = (BIGNUM *)0x0;
  local_1c8 = (BIGNUM *)0x0;
  local_1d8 = (BN_CTX *)0x0;
  if ((((in_RDI != 0) && (in_RSI != 0)) && (in_RDX != 0)) &&
     (((-1 < in_ECX && (in_R9 != 0)) && (p_ctx != (ATE_CTX *)0x0)))) {
    local_1c0 = BN_new();
    local_1c8 = BN_new();
    local_1d8 = BN_CTX_new();
    a = G1_new();
    rop = (GT *)G2_new();
    op = GT_new();
    ctx = SM9_get_pairing_ctx();
    if (((local_1c0 != (BIGNUM *)0x0) && (local_1c8 != (BIGNUM *)0x0)) &&
       (((local_1d8 != (BN_CTX *)0x0 &&
         ((((a != (G1 *)0x0 && (rop != (GT *)0x0)) && (op != (GT *)0x0)) &&
          ((ctx != (ATE_CTX *)0x0 && (range = PAIRING_get0_order(ctx), range != (BIGNUM *)0x0))))))
        && (h_00 = PAIRING_get0_generator1(ctx), h_00 != (G1 *)0x0)))) {
      G2_point_uncompress((G2 *)op,(uint8_t *)ctx,
                          (ATE_CTX *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      optate(rop,(G1 *)op,(G2 *)ctx,
             (ATE_CTX *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      do {
        if (in_R8 == (uchar *)0x0) {
          do {
            iVar1 = BN_rand_range(local_1c8,(BIGNUM *)range);
            if (iVar1 == 0) goto LAB_00136ad3;
            iVar1 = BN_is_zero((BIGNUM *)local_1c8);
          } while (iVar1 != 0);
        }
        else {
          BN_bin2bn(in_R8,0x20,local_1c8);
        }
        fp12_pow(rop,op,(BIGNUM *)ctx,
                 (ATE_CTX *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        GT_to_bin(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        sm9_H2((BIGNUM *)h_00,(uint8_t *)a,(int)((ulong)rop >> 0x20),(uint8_t *)op,
               (int)((ulong)ctx >> 0x20),
               (BIGNUM *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        BN_mod_sub(local_1c8,local_1c8,local_1c0,(BIGNUM *)range,local_1d8);
        iVar1 = BN_is_zero((BIGNUM *)local_1c8);
      } while (iVar1 != 0);
      G1_point_uncompress((G1 *)op,(uint8_t *)ctx,
                          (ATE_CTX *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      G1_mul((G1 *)rop,(G1 *)op,(BIGNUM *)ctx,
             (ATE_CTX *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      BN_bn2binpad((BIGNUM *)op,(uchar *)ctx,in_stack_fffffffffffffdfc);
      G1_point_compress((uint8_t *)ctx,
                        (G1 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (ATE_CTX *)0x136ac8);
      local_34 = 1;
    }
  }
LAB_00136ad3:
  BN_free(local_1c0);
  BN_free(local_1c8);
  BN_CTX_free(local_1d8);
  G1_free((G1 *)0x136afb);
  G2_free((G2 *)0x136b05);
  GT_free((GT *)0x136b0f);
  return local_34;
}

Assistant:

int SM9_sign(uint8_t h[32], uint8_t S[65], 
             const uint8_t *msg, int msglen, uint8_t rand[32], 
             const uint8_t usr_privkey[65], const uint8_t master_pubkey[129])
{
    int ret = GML_ERROR;
    uint8_t w[384];
    BIGNUM *h_bn = NULL;
    BIGNUM *r = NULL;
    const BIGNUM *order = NULL;
    BN_CTX *bn_ctx = NULL;
    const G1 *P = NULL;
    G1 *da = NULL;
    G2 *Ppub = NULL;
    GT *g = NULL;
    const ATE_CTX *p_ctx = NULL;

    if (h == NULL || S == NULL || msg == NULL || msglen < 0 || usr_privkey == NULL || master_pubkey == NULL)
        goto end;

    h_bn = BN_new();
    r = BN_new();
    bn_ctx = BN_CTX_new();
    da = G1_new();
    Ppub = G2_new();
    g = GT_new();
    p_ctx = SM9_get_pairing_ctx();

    if (h_bn == NULL || r == NULL || bn_ctx == NULL || da == NULL ||
        Ppub == NULL || g == NULL || p_ctx == NULL )
        goto end;

    order = PAIRING_get0_order(p_ctx);
    if (order == NULL)
        goto end;

    /* P */
    P = PAIRING_get0_generator1(p_ctx);
    if (P == NULL)
        goto end;
    /* Ppub */
    G2_point_uncompress(Ppub, master_pubkey, p_ctx);

    /* g = e(P, Ppub) */
    optate(g, P, Ppub, p_ctx);

    do {
        if (rand == NULL) {
            /* random r */
            do {
                if (!BN_rand_range(r, order)) 
                    goto end;
            } while (BN_is_zero(r));
        }
        else
            BN_bin2bn(rand, 32, r);
        
        fp12_pow(g, g, r, p_ctx);

        /*  */
        GT_to_bin(w, g, p_ctx);

        /* H2(M||w, N) */
        sm9_H2(h_bn, msg, msglen, w, 384, order);

        /* r - h */
        BN_mod_sub(r, r, h_bn, order, bn_ctx);
    } while(BN_is_zero(r));

    /* da */
    G1_point_uncompress(da, usr_privkey, p_ctx);
    /* (r - h) * da */
    G1_mul(da, da, r, p_ctx);

    BN_bn2binpad(h_bn, h, 32);
    G1_point_compress(S, da, p_ctx);

    ret = GML_OK;
end:
    BN_free(h_bn);
    BN_free(r);
    BN_CTX_free(bn_ctx);
    G1_free(da);
    G2_free(Ppub);
    GT_free(g);
    return ret;
}